

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O1

ButtonRole __thiscall QDialogButtonBox::buttonRole(QDialogButtonBox *this,QAbstractButton *button)

{
  long lVar1;
  ulong uVar2;
  long *plVar3;
  ulong uVar4;
  ButtonRole BVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  bool bVar9;
  bool bVar10;
  const_iterator cVar11;
  QAbstractButton *local_20;
  ulong local_18;
  
  local_18 = *(ulong *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  uVar7 = 0;
  bVar9 = false;
  uVar6 = local_18;
  do {
    uVar2 = *(ulong *)(lVar1 + 0x268 + uVar7 * 0x18);
    bVar10 = uVar2 != 0;
    if (bVar10) {
      plVar3 = *(long **)(lVar1 + uVar7 * 0x18 + 0x260);
      if ((QAbstractButton *)*plVar3 == button) {
        uVar6 = uVar7 & 0xffffffff;
      }
      else {
        uVar4 = 1;
        do {
          uVar8 = uVar4;
          if (uVar2 == uVar8) goto LAB_00477742;
          uVar4 = uVar8 + 1;
        } while ((QAbstractButton *)plVar3[uVar8] != button);
        uVar6 = uVar7 & 0xffffffff;
LAB_00477742:
        bVar10 = uVar8 < uVar2;
      }
    }
    BVar5 = (ButtonRole)uVar6;
    if (bVar10) break;
    bVar9 = 7 < uVar7;
    uVar7 = uVar7 + 1;
  } while (uVar7 != 9);
  local_20 = button;
  if (bVar9) {
    cVar11 = QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
             ::find((QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
                     *)(lVar1 + 0x3c0),&local_20);
    if ((cVar11.c != (containers *)(lVar1 + 0x3c0)) ||
       (BVar5 = InvalidRole, cVar11.i != *(long *)(lVar1 + 0x3c8))) {
      BVar5 = *(ButtonRole *)
               ((long)((cVar11.c)->values).super_QVLABase<QDialogButtonBox::ButtonRole>.
                      super_QVLABaseBase.ptr + cVar11.i * 4);
    }
  }
  if (*(ulong *)(in_FS_OFFSET + 0x28) == local_18) {
    return BVar5;
  }
  __stack_chk_fail();
}

Assistant:

QDialogButtonBox::ButtonRole QDialogButtonBox::buttonRole(QAbstractButton *button) const
{
    Q_D(const QDialogButtonBox);
    for (int i = 0; i < NRoles; ++i) {
        const QList<QAbstractButton *> &list = d->buttonLists[i];
        for (int j = 0; j < list.size(); ++j) {
            if (list.at(j) == button)
                return ButtonRole(i);
        }
    }
    return d->hiddenButtons.value(button, InvalidRole);
}